

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O0

bool __thiscall tinyusdz::ascii::AsciiParser::ReadUntilNewline(AsciiParser *this,string *str)

{
  bool bVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  string local_1d8 [39];
  char local_1b1 [8];
  char d;
  stringstream local_1a8 [7];
  char c;
  stringstream ss;
  ostream aoStack_198 [376];
  string *local_20;
  string *str_local;
  AsciiParser *this_local;
  
  local_20 = str;
  str_local = (string *)this;
  ::std::__cxx11::stringstream::stringstream(local_1a8);
  do {
    bVar1 = Eof(this);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
LAB_0061263b:
      (this->_curr_cursor).row = (this->_curr_cursor).row + 1;
      (this->_curr_cursor).col = 0;
      ::std::__cxx11::stringstream::str();
      ::std::__cxx11::string::operator=((string *)local_20,local_1d8);
      ::std::__cxx11::string::~string(local_1d8);
      this_local._7_1_ = 1;
LAB_0061268f:
      local_1b1[1] = '\x01';
      local_1b1[2] = '\0';
      local_1b1[3] = '\0';
      local_1b1[4] = '\0';
      ::std::__cxx11::stringstream::~stringstream(local_1a8);
      return (bool)(this_local._7_1_ & 1);
    }
    bVar1 = Char1(this,&d);
    if (!bVar1) {
      this_local._7_1_ = 0;
      goto LAB_0061268f;
    }
    if (d == '\n') goto LAB_0061263b;
    if (d == '\r') {
      uVar2 = StreamReader::tell(this->_sr);
      uVar3 = StreamReader::size(this->_sr);
      if (uVar2 < uVar3 - 1) {
        bVar1 = Char1(this,local_1b1);
        if (!bVar1) {
          this_local._7_1_ = 0;
          goto LAB_0061268f;
        }
        if ((local_1b1[0] != '\n') &&
           (bVar1 = StreamReader::seek_from_current(this->_sr,-1), !bVar1)) {
          this_local._7_1_ = 0;
          goto LAB_0061268f;
        }
        goto LAB_0061263b;
      }
    }
    ::std::operator<<(aoStack_198,d);
  } while( true );
}

Assistant:

bool AsciiParser::ReadUntilNewline(std::string *str) {
  std::stringstream ss;

  while (!Eof()) {
    char c;
    if (!Char1(&c)) {
      // this should not happen.
      return false;
    }

    if (c == '\n') {
      break;
    } else if (c == '\r') {
      // CRLF?
      if (_sr->tell() < (_sr->size() - 1)) {
        char d;
        if (!Char1(&d)) {
          // this should not happen.
          return false;
        }

        if (d == '\n') {
          break;
        }

        // unwind 1 char
        if (!_sr->seek_from_current(-1)) {
          // this should not happen.
          return false;
        }

        break;
      }
    }

    ss << c;
  }

  _curr_cursor.row++;
  _curr_cursor.col = 0;

  (*str) = ss.str();

  return true;
}